

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

Status __thiscall leveldb::TableBuilder::Finish(TableBuilder *this)

{
  Rep *options;
  Comparator *pCVar1;
  WritableFile *pWVar2;
  bool bVar3;
  long lVar4;
  TableBuilder *in_RSI;
  Slice local_1c8;
  Status local_1b8;
  undefined1 local_1b0 [8];
  string footer_encoding;
  Footer footer;
  Slice local_160;
  undefined1 local_150 [8];
  string handle_encoding_1;
  Slice local_120;
  undefined1 local_110 [8];
  string handle_encoding;
  undefined1 local_e8 [8];
  string key;
  BlockBuilder meta_index_block;
  undefined1 local_50 [8];
  BlockHandle index_block_handle;
  BlockHandle metaindex_block_handle;
  BlockHandle filter_block_handle;
  Rep *r;
  TableBuilder *this_local;
  
  options = in_RSI->rep_;
  Flush(in_RSI);
  if (((options->closed ^ 0xffU) & 1) != 0) {
    options->closed = true;
    BlockHandle::BlockHandle((BlockHandle *)&metaindex_block_handle.size_);
    BlockHandle::BlockHandle((BlockHandle *)&index_block_handle.size_);
    BlockHandle::BlockHandle((BlockHandle *)local_50);
    bVar3 = ok(in_RSI);
    if ((bVar3) && (options->filter_block != (FilterBlockBuilder *)0x0)) {
      join_0x00000010_0x00000000_ = FilterBlockBuilder::Finish(options->filter_block);
      WriteRawBlock(in_RSI,(Slice *)((long)&meta_index_block.last_key_.field_2 + 8),kNoCompression,
                    (BlockHandle *)&metaindex_block_handle.size_);
    }
    bVar3 = ok(in_RSI);
    if (bVar3) {
      BlockBuilder::BlockBuilder((BlockBuilder *)((long)&key.field_2 + 8),&options->options);
      if (options->filter_block != (FilterBlockBuilder *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_e8,"filter.",
                   (allocator *)(handle_encoding.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(handle_encoding.field_2._M_local_buf + 0xf));
        (*((options->options).filter_policy)->_vptr_FilterPolicy[2])();
        std::__cxx11::string::append(local_e8);
        std::__cxx11::string::string((string *)local_110);
        BlockHandle::EncodeTo((BlockHandle *)&metaindex_block_handle.size_,(string *)local_110);
        Slice::Slice(&local_120,(string *)local_e8);
        Slice::Slice((Slice *)((long)&handle_encoding_1.field_2 + 8),(string *)local_110);
        BlockBuilder::Add((BlockBuilder *)((long)&key.field_2 + 8),&local_120,
                          (Slice *)((long)&handle_encoding_1.field_2 + 8));
        std::__cxx11::string::~string((string *)local_110);
        std::__cxx11::string::~string((string *)local_e8);
      }
      WriteBlock(in_RSI,(BlockBuilder *)((long)&key.field_2 + 8),
                 (BlockHandle *)&index_block_handle.size_);
      BlockBuilder::~BlockBuilder((BlockBuilder *)((long)&key.field_2 + 8));
    }
    bVar3 = ok(in_RSI);
    if (bVar3) {
      if ((options->pending_index_entry & 1U) != 0) {
        pCVar1 = (options->options).comparator;
        (*pCVar1->_vptr_Comparator[5])(pCVar1,&options->last_key);
        std::__cxx11::string::string((string *)local_150);
        BlockHandle::EncodeTo(&options->pending_handle,(string *)local_150);
        Slice::Slice(&local_160,&options->last_key);
        Slice::Slice((Slice *)&footer.index_handle_.size_,(string *)local_150);
        BlockBuilder::Add(&options->index_block,&local_160,(Slice *)&footer.index_handle_.size_);
        options->pending_index_entry = false;
        std::__cxx11::string::~string((string *)local_150);
      }
      WriteBlock(in_RSI,&options->index_block,(BlockHandle *)local_50);
    }
    bVar3 = ok(in_RSI);
    if (bVar3) {
      Footer::Footer((Footer *)((long)&footer_encoding.field_2 + 8));
      Footer::set_metaindex_handle
                ((Footer *)((long)&footer_encoding.field_2 + 8),
                 (BlockHandle *)&index_block_handle.size_);
      Footer::set_index_handle
                ((Footer *)((long)&footer_encoding.field_2 + 8),(BlockHandle *)local_50);
      std::__cxx11::string::string((string *)local_1b0);
      Footer::EncodeTo((Footer *)((long)&footer_encoding.field_2 + 8),(string *)local_1b0);
      pWVar2 = options->file;
      Slice::Slice(&local_1c8,(string *)local_1b0);
      (*pWVar2->_vptr_WritableFile[2])(&local_1b8,pWVar2,&local_1c8);
      Status::operator=(&options->status,&local_1b8);
      Status::~Status(&local_1b8);
      bVar3 = Status::ok(&options->status);
      if (bVar3) {
        lVar4 = std::__cxx11::string::size();
        options->offset = lVar4 + options->offset;
      }
      std::__cxx11::string::~string((string *)local_1b0);
    }
    Status::Status((Status *)this,&options->status);
    return (Status)(char *)this;
  }
  __assert_fail("!r->closed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/table_builder.cc"
                ,0xc9,"Status leveldb::TableBuilder::Finish()");
}

Assistant:

Status TableBuilder::Finish() {
  Rep* r = rep_;
  Flush();
  assert(!r->closed);
  r->closed = true;

  BlockHandle filter_block_handle, metaindex_block_handle, index_block_handle;

  // Write filter block
  if (ok() && r->filter_block != nullptr) {
    WriteRawBlock(r->filter_block->Finish(), kNoCompression,
                  &filter_block_handle);
  }

  // Write metaindex block
  if (ok()) {
    BlockBuilder meta_index_block(&r->options);
    if (r->filter_block != nullptr) {
      // Add mapping from "filter.Name" to location of filter data
      std::string key = "filter.";
      key.append(r->options.filter_policy->Name());
      std::string handle_encoding;
      filter_block_handle.EncodeTo(&handle_encoding);
      meta_index_block.Add(key, handle_encoding);
    }

    // TODO(postrelease): Add stats and other meta blocks
    WriteBlock(&meta_index_block, &metaindex_block_handle);
  }

  // Write index block
  if (ok()) {
    if (r->pending_index_entry) {
      r->options.comparator->FindShortSuccessor(&r->last_key);
      std::string handle_encoding;
      r->pending_handle.EncodeTo(&handle_encoding);
      r->index_block.Add(r->last_key, Slice(handle_encoding));
      r->pending_index_entry = false;
    }
    WriteBlock(&r->index_block, &index_block_handle);
  }

  // Write footer
  if (ok()) {
    Footer footer;
    footer.set_metaindex_handle(metaindex_block_handle);
    footer.set_index_handle(index_block_handle);
    std::string footer_encoding;
    footer.EncodeTo(&footer_encoding);
    r->status = r->file->Append(footer_encoding);
    if (r->status.ok()) {
      r->offset += footer_encoding.size();
    }
  }
  return r->status;
}